

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1242f28::TargetCompileDefinitionsImpl::HandleDirectContent
          (TargetCompileDefinitionsImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  allocator<char> local_89;
  undefined1 local_88 [16];
  _Optional_payload_base<cmListFileBacktrace> local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"COMPILE_DEFINITIONS",&local_89);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(&local_58,this,content);
  cmMakefile::GetBacktrace((cmMakefile *)local_88);
  local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_88._0_8_;
  local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_88._8_8_;
  local_88._0_8_ = (_Map_pointer)0x0;
  local_88._8_8_ = 0;
  local_78._M_engaged = true;
  cmTarget::AppendProperty(tgt,&local_38,&local_58,(optional<cmListFileBacktrace> *)&local_78,false)
  ;
  std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    tgt->AppendProperty("COMPILE_DEFINITIONS", this->Join(content),
                        this->Makefile->GetBacktrace());
    return true; // Successfully handled.
  }